

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseChat_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_38,"id",&local_39);
  appendToJson<long>(this,__return_storage_ptr__,&local_38,
                     &((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->id);
  std::__cxx11::string::~string((string *)&local_38);
  switch(((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type) {
  case Private:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[8]>(this,__return_storage_ptr__,&local_38,(char (*) [8])"private");
    break;
  case Group:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[6]>(this,__return_storage_ptr__,&local_38,(char (*) [6])0x273169);
    break;
  case Supergroup:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[11]>(this,__return_storage_ptr__,&local_38,(char (*) [11])"supergroup");
    break;
  case Channel:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[8]>(this,__return_storage_ptr__,&local_38,(char (*) [8])"channel");
    break;
  default:
    goto switchD_001e2fd0_default;
  }
  std::__cxx11::string::~string((string *)&local_38);
switchD_001e2fd0_default:
  psVar1 = &local_38;
  std::__cxx11::string::string((string *)psVar1,"title",&local_39);
  appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                title);
  std::__cxx11::string::~string((string *)&local_38);
  psVar1 = &local_38;
  std::__cxx11::string::string((string *)psVar1,"username",&local_39);
  appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                username);
  std::__cxx11::string::~string((string *)&local_38);
  psVar1 = &local_38;
  std::__cxx11::string::string((string *)psVar1,"first_name",&local_39);
  appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                firstName);
  std::__cxx11::string::~string((string *)&local_38);
  psVar1 = &local_38;
  std::__cxx11::string::string((string *)psVar1,"last_name",&local_39);
  appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                lastName);
  std::__cxx11::string::~string((string *)&local_38);
  removeLastComma(this,__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseChat(const Chat::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    if (object->type == Chat::Type::Private) {
        appendToJson(result, "type", "private");
    } else if (object->type == Chat::Type::Group) {
        appendToJson(result, "type", "group");
    } else if (object->type == Chat::Type::Supergroup) {
        appendToJson(result, "type", "supergroup");
    } else if (object->type == Chat::Type::Channel) {
        appendToJson(result, "type", "channel");
    }
    appendToJson(result, "title", object->title);
    appendToJson(result, "username", object->username);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    removeLastComma(result);
    result += '}';
    return result;
}